

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  Clause *from;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *pOVar4;
  Clause elem;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  vec<unsigned_int,_int> *pvVar9;
  Clause *c;
  long lVar10;
  long lVar11;
  int local_3c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_38;
  
  if (this->use_simplification == true) {
    local_3c = 0;
    if (0 < (this->super_Solver).next_var) {
      local_38 = &this->occurs;
      do {
        pOVar4 = local_38;
        OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
        ::clean(local_38,&local_3c);
        pvVar9 = (pOVar4->occs).map.data;
        if (0 < pvVar9[local_3c].sz) {
          pvVar9 = pvVar9 + local_3c;
          lVar10 = 0;
          lVar11 = 0;
          do {
            ClauseAllocator::reloc
                      (&(this->super_Solver).ca,(CRef *)((long)pvVar9->data + lVar10),to);
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 4;
          } while (lVar11 < pvVar9->sz);
        }
        local_3c = local_3c + 1;
      } while (local_3c < (this->super_Solver).next_var);
    }
    iVar8 = (this->subsumption_queue).first;
    iVar5 = (this->subsumption_queue).end;
    iVar7 = 0;
    if (iVar5 < iVar8) {
      iVar7 = (this->subsumption_queue).buf.sz;
    }
    iVar6 = (iVar5 - iVar8) + iVar7;
    if (iVar6 != 0 && SCARRY4(iVar5 - iVar8,iVar7) == iVar6 < 0) {
      iVar8 = ((iVar7 + iVar5) - iVar8) + 1;
      do {
        iVar5 = (this->subsumption_queue).first;
        uVar1 = (this->subsumption_queue).buf.data[iVar5];
        iVar5 = iVar5 + 1;
        if (iVar5 == (this->subsumption_queue).buf.sz) {
          iVar5 = 0;
        }
        puVar3 = (this->super_Solver).ca.ra.memory;
        (this->subsumption_queue).first = iVar5;
        uVar2 = puVar3[uVar1];
        if ((uVar2 & 3) == 0) {
          from = (Clause *)(puVar3 + uVar1);
          if ((uVar2 & 0x10) == 0) {
            elem.header = (anon_struct_4_5_613047fb_for_header)ClauseAllocator::alloc(to,from);
            *(byte *)&from->header = *(byte *)&from->header | 0x10;
            from[1].header = elem.header;
          }
          else {
            elem.header = from[1].header;
          }
          Queue<unsigned_int>::insert(&this->subsumption_queue,(uint)elem.header);
        }
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
    }
    ClauseAllocator::reloc(&(this->super_Solver).ca,&this->bwdsub_tmpunit,to);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        occurs.clean(i);
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = subsumption_queue.size(); i > 0; i--){
        CRef cr = subsumption_queue.peek(); subsumption_queue.pop();
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }
        
    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}